

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_remotes.cpp
# Opt level: O0

Remotes * Omega_h::identity_remotes(Remotes *__return_storage_ptr__,CommPtr *comm,LO n)

{
  LO size_in;
  I32 value;
  element_type *this;
  allocator local_99;
  string local_98 [32];
  Read<int> local_78 [2];
  allocator local_51;
  string local_50 [32];
  Read<int> local_30;
  LO local_1c;
  CommPtr *pCStack_18;
  LO n_local;
  CommPtr *comm_local;
  
  local_1c = n;
  pCStack_18 = comm;
  comm_local = (CommPtr *)__return_storage_ptr__;
  this = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    comm);
  value = Comm::rank(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"",&local_51);
  Read<int>::Read(&local_30,n,value,(string *)local_50);
  size_in = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"",&local_99);
  Read<int>::Read(local_78,size_in,0,1,(string *)local_98);
  Remotes::Remotes(__return_storage_ptr__,&local_30,local_78);
  Read<int>::~Read(local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  Read<int>::~Read(&local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return __return_storage_ptr__;
}

Assistant:

Remotes identity_remotes(CommPtr comm, LO n) {
  return Remotes(Read<I32>(n, comm->rank()), LOs(n, 0, 1));
}